

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<unsigned_int,unsigned_int,duckdb::ParquetCastOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  uint uVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  long lVar4;
  NumericStatisticsState<unsigned_int,_unsigned_int,_duckdb::BaseParquetOperator> *numeric_stats;
  uint local_write [2048];
  uint local_2038 [2050];
  
  if (chunk_start < chunk_end) {
    pdVar2 = col->data;
    lVar4 = 0;
    do {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) ||
         ((puVar3[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)(pdVar2 + chunk_start * 4);
        if (uVar1 < *(uint *)&stats[1]._vptr_ColumnWriterStatistics) {
          *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar1;
        }
        if (*(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < uVar1) {
          *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = uVar1;
        }
        local_2038[lVar4] = uVar1;
        lVar4 = lVar4 + 1;
        if (lVar4 == 0x800) {
          (**ser->_vptr_WriteStream)(ser,local_2038,0x2000);
          lVar4 = 0;
        }
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
    lVar4 = lVar4 << 2;
  }
  else {
    lVar4 = 0;
  }
  (**ser->_vptr_WriteStream)(ser,local_2038,lVar4);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}